

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_parse.c
# Opt level: O3

C_Node * mul(C_Parser *parser,C_Token **rest,C_Token *tok)

{
  C_Token *pCVar1;
  _Bool _Var2;
  C_Node *pCVar3;
  C_Node *pCVar4;
  C_Node *pCVar5;
  C_NodeKind CVar6;
  C_Token *local_40;
  C_Token **local_38;
  
  local_40 = tok;
  local_38 = rest;
  pCVar3 = cast(parser,&local_40,tok);
  do {
    pCVar1 = local_40;
    _Var2 = C_equal(local_40,"*");
    CVar6 = ND_MUL;
    if (!_Var2) {
      _Var2 = C_equal(local_40,"/");
      CVar6 = ND_DIV;
      if (!_Var2) {
        _Var2 = C_equal(local_40,"%");
        CVar6 = ND_MOD;
        if (!_Var2) {
          *local_38 = local_40;
          return pCVar3;
        }
      }
    }
    pCVar4 = cast(parser,&local_40,local_40->next);
    pCVar5 = (C_Node *)(*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
    pCVar5->kind = CVar6;
    pCVar5->tok = pCVar1;
    pCVar5->lhs = pCVar3;
    pCVar5->rhs = pCVar4;
    pCVar3 = pCVar5;
  } while( true );
}

Assistant:

static C_Node *mul(C_Parser *parser, C_Token **rest, C_Token *tok) {
  C_Node *node = cast(parser, &tok, tok);

  for (;;) {
    C_Token *start = tok;

    if (C_equal(tok, "*")) {
      node = new_binary(parser, ND_MUL, node, cast(parser, &tok, tok->next), start);
      continue;
    }

    if (C_equal(tok, "/")) {
      node = new_binary(parser, ND_DIV, node, cast(parser, &tok, tok->next), start);
      continue;
    }

    if (C_equal(tok, "%")) {
      node = new_binary(parser, ND_MOD, node, cast(parser, &tok, tok->next), start);
      continue;
    }

    *rest = tok;
    return node;
  }
}